

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

char * __thiscall
Fossilize::StateRecorder::Impl::copy<char>
          (Impl *this,char *src,size_t count,ScratchAllocator *alloc)

{
  char *pcVar1;
  
  if (count != 0) {
    pcVar1 = ScratchAllocator::allocate_n<char>(alloc,count);
    if (pcVar1 != (char *)0x0) {
      pcVar1 = (char *)memmove(pcVar1,src,count);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}